

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

void lj_tab_resize(lua_State *L,GCtab *t,uint32_t asize,uint32_t hbits)

{
  long lVar1;
  uint uVar2;
  uint64_t uVar3;
  void *pvVar4;
  void *pvVar5;
  undefined8 *puVar6;
  uint64_t uVar7;
  TValue *pTVar8;
  TValue *pTVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  TValue *oarray;
  ulong uVar13;
  int iVar14;
  
  uVar3 = (t->node).ptr64;
  uVar12 = t->asize;
  uVar13 = (ulong)uVar12;
  uVar2 = t->hmask;
  if (uVar12 < asize) {
    if (0x8000001 < asize) goto LAB_001288ef;
    pvVar5 = (void *)(t->array).ptr64;
    if (t->colo < '\x01') {
      pvVar4 = lj_mem_realloc(L,pvVar5,uVar13 * 8,(ulong)(asize * 8));
    }
    else {
      pvVar4 = lj_mem_realloc(L,(void *)0x0,0,(ulong)(asize * 8));
      t->colo = t->colo | 0x80;
      if (uVar13 != 0) {
        uVar10 = 0;
        do {
          *(undefined8 *)((long)pvVar4 + uVar10 * 8) = *(undefined8 *)((long)pvVar5 + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while (uVar13 != uVar10);
      }
    }
    (t->array).ptr64 = (uint64_t)pvVar4;
    t->asize = asize;
    memset((void *)((long)pvVar4 + uVar13 * 8),0xff,(ulong)(~uVar12 + asize) * 8 + 8);
  }
  if (hbits == 0) {
    uVar7 = (L->glref).ptr64 + 0xf8;
    (t->node).ptr64 = uVar7;
    (t->freetop).ptr64 = uVar7;
    t->hmask = 0;
  }
  else {
    if (0x1a < hbits) {
LAB_001288ef:
      lj_err_msg(L,LJ_ERR_TABOV);
    }
    uVar11 = 1 << ((byte)hbits & 0x1f);
    uVar10 = (ulong)uVar11;
    pvVar5 = lj_mem_realloc(L,(void *)0x0,0,0x18L << ((byte)hbits & 0x3f));
    (t->node).ptr64 = (uint64_t)pvVar5;
    (t->freetop).ptr64 = (uint64_t)((long)pvVar5 + uVar10 * 0x18);
    t->hmask = uVar11 - 1;
    puVar6 = (undefined8 *)((long)pvVar5 + 0x10);
    do {
      *puVar6 = 0;
      *(undefined4 *)(puVar6 + -2) = 0xffffffff;
      *(undefined4 *)((long)puVar6 + -0xc) = 0xffffffff;
      *(undefined4 *)(puVar6 + -1) = 0xffffffff;
      *(undefined4 *)((long)puVar6 + -4) = 0xffffffff;
      puVar6 = puVar6 + 3;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  if (asize < uVar12) {
    pvVar5 = (void *)(t->array).ptr64;
    t->asize = asize;
    iVar14 = uVar12 - asize;
    uVar10 = (ulong)asize;
    do {
      if (*(long *)((long)pvVar5 + uVar10 * 8) != -1) {
        pTVar8 = lj_tab_setinth(L,t,(int32_t)uVar10);
        *pTVar8 = *(TValue *)((long)pvVar5 + uVar10 * 8);
      }
      uVar10 = uVar10 + 1;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
    if (t->colo < '\x01') {
      pvVar5 = lj_mem_realloc(L,pvVar5,uVar13 << 3,(ulong)asize << 3);
      (t->array).ptr64 = (uint64_t)pvVar5;
    }
  }
  if ((ulong)uVar2 == 0) {
    return;
  }
  uVar13 = 0;
  do {
    if (*(long *)(uVar3 + uVar13 * 0x18) != -1) {
      pTVar8 = (TValue *)(uVar3 + uVar13 * 0x18);
      pTVar9 = lj_tab_set(L,t,pTVar8 + 1);
      *pTVar9 = *pTVar8;
    }
    uVar12 = (int)uVar13 + 1;
    uVar13 = (ulong)uVar12;
  } while (uVar12 <= uVar2);
  puVar6 = (undefined8 *)(L->glref).ptr64;
  lVar1 = (ulong)uVar2 * 0x18 + 0x18;
  puVar6[2] = puVar6[2] - lVar1;
  (*(code *)*puVar6)(puVar6[1],uVar3,lVar1,0,(code *)*puVar6);
  return;
}

Assistant:

void lj_tab_resize(lua_State *L, GCtab *t, uint32_t asize, uint32_t hbits)
{
  Node *oldnode = noderef(t->node);
  uint32_t oldasize = t->asize;
  uint32_t oldhmask = t->hmask;
  if (asize > oldasize) {  /* Array part grows? */
    TValue *array;
    uint32_t i;
    if (asize > LJ_MAX_ASIZE)
      lj_err_msg(L, LJ_ERR_TABOV);
    if (LJ_MAX_COLOSIZE != 0 && t->colo > 0) {
      /* A colocated array must be separated and copied. */
      TValue *oarray = tvref(t->array);
      array = lj_mem_newvec(L, asize, TValue);
      t->colo = (int8_t)(t->colo | 0x80);  /* Mark as separated (colo < 0). */
      for (i = 0; i < oldasize; i++)
	copyTV(L, &array[i], &oarray[i]);
    } else {
      array = (TValue *)lj_mem_realloc(L, tvref(t->array),
			  oldasize*sizeof(TValue), asize*sizeof(TValue));
    }
    setmref(t->array, array);
    t->asize = asize;
    for (i = oldasize; i < asize; i++)  /* Clear newly allocated slots. */
      setnilV(&array[i]);
  }
  /* Create new (empty) hash part. */
  if (hbits) {
    newhpart(L, t, hbits);
    clearhpart(t);
  } else {
    global_State *g = G(L);
    setmref(t->node, &g->nilnode);
#if LJ_GC64
    setmref(t->freetop, &g->nilnode);
#endif
    t->hmask = 0;
  }
  if (asize < oldasize) {  /* Array part shrinks? */
    TValue *array = tvref(t->array);
    uint32_t i;
    t->asize = asize;  /* Note: This 'shrinks' even colocated arrays. */
    for (i = asize; i < oldasize; i++)  /* Reinsert old array values. */
      if (!tvisnil(&array[i]))
	copyTV(L, lj_tab_setinth(L, t, (int32_t)i), &array[i]);
    /* Physically shrink only separated arrays. */
    if (LJ_MAX_COLOSIZE != 0 && t->colo <= 0)
      setmref(t->array, lj_mem_realloc(L, array,
	      oldasize*sizeof(TValue), asize*sizeof(TValue)));
  }
  if (oldhmask > 0) {  /* Reinsert pairs from old hash part. */
    global_State *g;
    uint32_t i;
    for (i = 0; i <= oldhmask; i++) {
      Node *n = &oldnode[i];
      if (!tvisnil(&n->val))
	copyTV(L, lj_tab_set(L, t, &n->key), &n->val);
    }
    g = G(L);
    lj_mem_freevec(g, oldnode, oldhmask+1, Node);
  }
}